

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testgecko.cpp
# Opt level: O0

int report(string *test,string *error,int columns)

{
  _Setw _Var1;
  ostream *poVar2;
  ulong uVar3;
  int in_EDX;
  string *in_RSI;
  string *in_RDI;
  bool bVar4;
  uint local_4;
  
  _Var1 = std::setw(in_EDX);
  poVar2 = std::operator<<((ostream *)&std::cerr,_Var1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::left);
  poVar2 = std::operator<<(poVar2,in_RDI);
  std::operator<<(poVar2," ");
  uVar3 = std::__cxx11::string::empty();
  bVar4 = (uVar3 & 1) != 0;
  if (bVar4) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"[ OK ]");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"[FAIL] ");
    poVar2 = std::operator<<(poVar2,in_RSI);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  local_4 = (uint)!bVar4;
  return local_4;
}

Assistant:

static int
report(std::string test, std::string error, int columns = 20)
{
  std::cerr << std::setw(columns) << std::left << test << " ";
  if (error.empty()) {
    std::cerr << "[ OK ]" << std::endl;
    return 0;
  }
  else {
    std::cerr << "[FAIL] " << error << std::endl;
    return 1;
  }
}